

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dogmove.c
# Opt level: O2

int dog_move(monst *mtmp,int after)

{
  char x;
  char y;
  bool bVar1;
  level *plVar2;
  byte bVar3;
  char cVar4;
  boolean bVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  obj *poVar13;
  void *pvVar14;
  coord *pcVar15;
  permonst *ppVar16;
  trap *ptVar17;
  long lVar18;
  char cVar19;
  xchar xVar20;
  char cVar21;
  char cVar22;
  int iVar23;
  int iVar24;
  char *pcVar25;
  int iVar26;
  char *pcVar27;
  int iVar28;
  undefined1 *puVar29;
  vptrs *pvVar30;
  ulong uVar31;
  monst *pmVar32;
  int y0;
  int iVar33;
  obj *obj;
  ulong uVar34;
  ulong uVar35;
  obj **obj_00;
  bool bVar36;
  char local_145;
  coord cc;
  int local_140;
  int local_11c;
  char local_110;
  int local_f8;
  coord poss [9];
  boolean cursemsg [9];
  long info [9];
  
  uVar12 = *(uint *)&mtmp->field_0x60;
  x = mtmp->mx;
  y = mtmp->my;
  if (((uVar12 >> 0x1a & 1) == 0) &&
     (iVar6 = *(int *)((long)&mtmp[1].data + 4), iVar6 + 500U < moves)) {
    if ((mtmp->data->mflags1 & 0x60000000) == 0) {
      *(uint *)((long)&mtmp[1].data + 4) = moves + 500;
    }
    else if (*(int *)&mtmp[1].minvent == 0) {
      iVar6 = mtmp->mhp;
      iVar26 = mtmp->mhpmax / 3;
      *(uint *)&mtmp->field_0x60 = uVar12 | 0x200000;
      *(int *)&mtmp[1].minvent = mtmp->mhpmax - iVar26;
      mtmp->mhpmax = iVar26;
      if (iVar26 < iVar6) {
        mtmp->mhp = iVar26;
        iVar6 = iVar26;
      }
      uVar7 = uVar12 | 0x200000;
      if (iVar6 < 1) goto LAB_00171de7;
      if ((viz_array[y][x] & 2U) == 0) {
        if ((viz_array[y][x] & 1U) == 0) {
          pcVar25 = y_monnam(mtmp);
          pcVar27 = "You feel worried about %s.";
          goto LAB_00171e84;
        }
        beg(mtmp);
      }
      else {
        pcVar25 = Monnam(mtmp);
        pcVar27 = "%s is confused from hunger.";
LAB_00171e84:
        pline(pcVar27,pcVar25);
      }
      stop_occupation();
    }
    else {
      uVar7 = uVar12;
      if ((iVar6 + 0x2eeU < moves) || (mtmp->mhp < 1)) {
LAB_00171de7:
        if (((uVar7 >> 0x18 & 1) == 0) || (u.usteed == mtmp)) {
          if ((viz_array[y][x] & 2U) == 0) {
            pcVar25 = "sad";
            if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
              if (u.umonnum == u.umonster) {
                pcVar25 = "bummed";
              }
              else {
                bVar5 = dmgtype(youmonst.data,0x24);
                pcVar25 = "sad";
                if (bVar5 == '\0') {
                  pcVar25 = "bummed";
                }
              }
            }
            pcVar27 = "You feel %s for a moment.";
          }
          else {
            pcVar25 = Monnam(mtmp);
            pcVar27 = "%s starves.";
          }
          pline(pcVar27,pcVar25);
        }
        else {
          pline("Your leash goes slack.");
        }
        mondied(mtmp);
        return 2;
      }
    }
  }
  iVar26 = (int)x;
  y0 = (int)y;
  iVar6 = dist2(iVar26,y0,(int)u.ux,(int)u.uy);
  if (u.usteed == mtmp) {
    iVar6 = 1;
    if ((u.uprops[0x15].extrinsic != 0 || u.uprops[0x15].intrinsic != 0) &&
       (iVar23 = resist(mtmp,'\x04',0,0), iVar23 == 0)) {
      dismount_steed(2);
      return 1;
    }
  }
  else if (iVar6 == 0) {
    return 0;
  }
  info[0] = 0;
  cursemsg[0] = '\0';
  if ((uVar12 >> 0x1a & 1) == 0) {
    if ((*(uint *)&mtmp->field_0x60 & 0xc0000) != 0x40000) {
LAB_00172069:
      puVar29 = &mtmp->field_0x74;
      bVar36 = moves - *(int *)&mtmp[1].data < 5;
      goto LAB_0017208a;
    }
    iVar33 = (int)mtmp->mx;
    iVar23 = (int)mtmp->my;
    poVar13 = DROPPABLES(mtmp);
    if (poVar13 != (obj *)0x0) {
      iVar23 = rn2(iVar6 + 1);
      if (((iVar23 == 0) || (iVar23 = rn2(*(int *)((long)&mtmp[1].nmon + 4)), iVar23 == 0)) &&
         (uVar7 = mt_random(), (int)(uVar7 % 10) < *(int *)((long)&mtmp[1].nmon + 4))) {
        relobj(mtmp,*(uint *)&mtmp->field_0x60 >> 1 & 1,'\x01');
        iVar23 = *(int *)((long)&mtmp[1].nmon + 4);
        if (1 < iVar23) {
          *(int *)((long)&mtmp[1].nmon + 4) = iVar23 + -1;
        }
        *(int *)&mtmp[1].nmon = iVar6;
        *(uint *)&mtmp->field_0x74 = moves;
      }
      goto LAB_00172069;
    }
    poVar13 = level->objects[iVar33][iVar23];
    if (((poVar13 == (obj *)0x0) ||
        (pvVar14 = memchr("\x0f\x10\x0e",(int)poVar13->oclass,4), pvVar14 != (void *)0x0)) ||
       (((poVar13->field_0x4b & 0x20) != 0 && (2 < (ushort)(poVar13->otyp - 0xdaU)))))
    goto LAB_00172069;
    iVar9 = dogfood(mtmp,poVar13);
    if (((1 < iVar9) && ((iVar9 != 2 || (*(int *)&mtmp[1].minvent == 0)))) ||
       (bVar5 = could_reach_item(mtmp,poVar13->ox,poVar13->oy), bVar5 == '\0')) {
      bVar5 = can_carry(mtmp,poVar13);
      if (((((bVar5 != '\0') && ((poVar13->field_0x4a & 1) == 0)) &&
           (bVar5 = could_reach_item(mtmp,poVar13->ox,poVar13->oy), bVar5 != '\0')) &&
          (uVar7 = mt_random(), (int)(uVar7 % 0x14) < *(int *)((long)&mtmp[1].nmon + 4) + 3)) &&
         ((iVar9 = rn2(iVar6), iVar9 != 0 ||
          (iVar9 = rn2(*(int *)((long)&mtmp[1].nmon + 4)), iVar9 == 0)))) {
        if (((viz_array[iVar23][iVar33] & 2U) != 0) && (flags.verbose != '\0')) {
          pcVar25 = Monnam(mtmp);
          pcVar27 = distant_name(poVar13,doname);
          pline("%s picks up %s.",pcVar25,pcVar27);
        }
        obj_extract_self(poVar13);
        newsym(iVar33,iVar23);
        mpickobj(mtmp,poVar13);
        bVar5 = attacktype(mtmp->data,0xfe);
        if ((bVar5 != '\0') && (mtmp->weapon_check == '\x01')) {
          mtmp->weapon_check = '\x03';
          mon_wield_item(mtmp);
        }
        m_dowear(level,mtmp,'\0');
      }
      goto LAB_00172069;
    }
    pmVar32 = (monst *)0x0;
    iVar6 = dog_eat(mtmp,poVar13,iVar33,iVar23,'\0');
    if (iVar6 == 2) {
      return 2;
    }
    local_f8 = -1;
    bVar36 = true;
    cVar22 = x;
    cVar21 = y;
    local_140 = iVar26;
  }
  else {
    puVar29 = (undefined1 *)0x0;
    bVar36 = false;
LAB_0017208a:
    if (u.usteed == mtmp) {
      return 0;
    }
    cVar4 = mtmp->mx;
    cVar19 = mtmp->my;
    bVar3 = viz_array[cVar19][cVar4];
    poVar13 = DROPPABLES(mtmp);
    if ((puVar29 == (undefined1 *)0x0) || ((mtmp->field_0x63 & 1) != 0)) {
      gtyp = '\x04';
      gx = u.ux;
      gy = u.uy;
      iVar23 = 1;
    }
    else {
      gtyp = '\x06';
      iVar23 = 6;
      if (6 < cVar4) {
        iVar23 = (int)cVar4;
      }
      gy = '\0';
      iVar33 = 0x4a;
      if (cVar4 < 0x4a) {
        iVar33 = (int)cVar4;
      }
      iVar9 = 5;
      if (5 < cVar19) {
        iVar9 = (int)cVar19;
      }
      iVar11 = 0xf;
      if (cVar19 < 0xf) {
        iVar11 = (int)cVar19;
      }
      gx = '\0';
      obj = (obj *)&level->objlist;
LAB_00172176:
      obj = obj->nobj;
      if (obj != (obj *)0x0) {
        cVar22 = obj->ox;
        iVar24 = (int)cVar22;
        if ((iVar23 + -5 <= iVar24) && (iVar24 <= iVar33 + 5)) {
          cVar21 = obj->oy;
          iVar28 = (int)cVar21;
          if ((iVar9 + -5 <= iVar28) && (iVar28 <= iVar11 + 5)) {
            iVar8 = dogfood(mtmp,obj);
            if ((((iVar8 << 0x18 != 0x6000000) && (xVar20 = (xchar)iVar8, xVar20 <= gtyp)) &&
                ((bVar5 = cursed_object_at(iVar24,iVar28), bVar5 == '\0' ||
                 ((xVar20 < '\x03' && (*(int *)(puVar29 + 0x1c) != 0)))))) &&
               ((bVar5 = could_reach_item(mtmp,cVar22,cVar21), bVar5 != '\0' &&
                (bVar5 = can_reach_location(mtmp,mtmp->mx,mtmp->my,cVar22,cVar21), bVar5 != '\0'))))
            {
              if (xVar20 < '\x03') {
                if (gtyp <= xVar20) {
                  iVar24 = dist2(iVar24,iVar28,(int)cVar4,(int)cVar19);
                  iVar28 = dist2((int)gx,(int)gy,(int)cVar4,(int)cVar19);
                  if (iVar28 <= iVar24) goto LAB_00172176;
                }
              }
              else {
                if (((((poVar13 != (obj *)0x0 || (bVar3 & 1) == 0) || gtyp != '\x06') ||
                     (((level->locations[cVar4][cVar19].field_0x7 & 4) != 0 &&
                      ((level->locations[u.ux][u.uy].field_0x7 & 4) == 0)))) ||
                    ((iVar8 << 0x18 != 0x3000000 &&
                     (bVar5 = clear_path((int)mtmp->mx,(int)mtmp->my,iVar24,iVar28), bVar5 == '\0'))
                    )) || (iVar24 = *(int *)(puVar29 + 8), uVar7 = mt_random(),
                          iVar24 <= (int)(uVar7 & 7))) goto LAB_00172176;
                bVar5 = can_carry(mtmp,obj);
                xVar20 = '\x04';
                if (bVar5 == '\0') goto LAB_00172176;
              }
              gx = cVar22;
              gy = cVar21;
              gtyp = xVar20;
            }
          }
        }
        goto LAB_00172176;
      }
      if ((gtyp == '\x06') ||
         ((iVar23 = 1, (gtyp & 0xfbU) != 0 && (moves < *(uint *)(puVar29 + 0x10))))) {
        gx = u.ux;
        gy = u.uy;
        if ((after != 0) && (iVar6 < 5)) {
          gx = u.ux;
          gy = u.uy;
          return 0;
        }
        iVar23 = 1;
        iVar33 = iVar23;
        if ((((iVar6 < 9) && (iVar33 = (*(int *)&mtmp->field_0x60 << 0xf) >> 0x1f, iVar6 < 2)) ||
            ((('\x18' < level->locations[u.ux][u.uy].typ &&
              (uVar7 = mt_random(), (uVar7 & 3) != 0 && !bVar36)) &&
             ((poVar13 == (obj *)0x0 || (iVar9 = rn2(*(int *)(puVar29 + 8)), iVar9 == 0)))))) &&
           (iVar23 = iVar33, iVar23 == 0)) {
          obj_00 = &invent;
          iVar23 = 1;
          do {
            obj_00 = &((obj *)obj_00)->nobj->nobj;
            if ((obj *)obj_00 == (obj *)0x0) {
              iVar23 = 0;
              break;
            }
            iVar33 = dogfood(mtmp,(obj *)obj_00);
          } while (iVar33 != 0);
        }
      }
    }
    iVar33 = 0;
    if ((mtmp->field_0x62 & 0x20) == 0) {
      iVar33 = iVar23;
    }
    if (((gx == u.ux) && (gy == u.uy)) && ((bVar3 & 1) == 0)) {
      pcVar15 = gettrack((int)cVar4,(int)cVar19);
      if (pcVar15 != (coord *)0x0) {
        gx = pcVar15->x;
        gy = pcVar15->y;
        goto joined_r0x00172433;
      }
      if (((puVar29 == (undefined1 *)0x0) || (gx = puVar29[0x20], gx == '\0')) ||
         (gy = puVar29[0x21], cVar19 == gy && cVar4 == gx)) {
        poss[0].x = 'D';
        poss[0].y = '\x1a';
        poss[1].x = '\0';
        poss[1].y = '\0';
        gy = 'R';
        gx = 'R';
        do_clear_area((int)cVar4,(int)cVar19,9,wantdoor,poss);
        xVar20 = gy;
        if ((gx == 'R') || (gy == cVar19 && gx == cVar4)) {
          gx = u.ux;
          gy = u.uy;
        }
        else if (puVar29 != (undefined1 *)0x0) {
          puVar29[0x20] = gx;
          puVar29[0x21] = xVar20;
        }
      }
      else {
        puVar29[0x20] = 0;
      }
    }
    else {
joined_r0x00172433:
      if (puVar29 != (undefined1 *)0x0) {
        puVar29[0x20] = 0;
      }
    }
    uVar34 = 0x660a0000;
    if ((mtmp->data->mflags1 & 8) == 0) {
      uVar34 = 0x600a0000;
    }
    bVar5 = passes_bars(mtmp->data);
    if ((bVar5 != '\0') || ((int)mtmp->data->mflags1 < 0)) {
      uVar34 = uVar34 | 0x10000000;
    }
    uVar34 = mtmp->data->mflags2 >> 2 & 0x2000000 | uVar34;
    if ((u.uprops[0x15].extrinsic != 0 || u.uprops[0x15].intrinsic != 0) &&
       (iVar23 = resist(mtmp,'\x04',0,0), iVar23 == 0)) {
      if ((uVar12 >> 0x1a & 1) != 0) {
        if (mtmp->wormno == '\0') {
          if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_001734ca;
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0017310f;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00173106;
          }
          else {
LAB_00173106:
            if (ublindf == (obj *)0x0) goto LAB_00173517;
LAB_0017310f:
            if (ublindf->oartifact != '\x1d') goto LAB_00173517;
          }
          if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
               (((youmonst.data)->mflags3 & 0x100) != 0)) &&
              ((viz_array[mtmp->my][mtmp->mx] & 1U) != 0)) && ((mtmp->data->mflags3 & 0x200) != 0))
          goto LAB_001734ca;
LAB_00173517:
          if (((mtmp->data->mflags1 & 0x10000) == 0) &&
             ((poVar13 = which_armor(mtmp,4), poVar13 == (obj *)0x0 ||
              (poVar13 = which_armor(mtmp,4), poVar13->otyp != 0x4f)))) {
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0017356e;
              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00173569;
            }
            else {
LAB_00173569:
              if (ublindf != (obj *)0x0) {
LAB_0017356e:
                if (ublindf->oartifact == '\x1d') goto LAB_00173601;
              }
              if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
                   (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
                   youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0))
              goto LAB_0017365d;
            }
LAB_00173601:
            if ((u.uprops[0x19].extrinsic != 0) &&
               ((u.uprops[0x19].blocked == 0 &&
                (iVar6 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), iVar6 < 0x41))))
            goto LAB_0017365d;
          }
          if ((u.uprops[0x42].intrinsic == 0) &&
             ((u.uprops[0x42].extrinsic == 0 && (bVar5 = match_warn_of_mon(mtmp), bVar5 == '\0'))))
          goto LAB_00173689;
        }
        else {
          bVar5 = worm_known(level,mtmp);
          if (bVar5 == '\0') goto LAB_00173517;
LAB_001734ca:
          uVar12 = *(uint *)&mtmp->field_0x60;
          if ((((uVar12 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
             (u.uprops[0xc].extrinsic == 0)) {
            if (((uVar12 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
            goto LAB_00173509;
            goto LAB_00173517;
          }
          if ((uVar12 & 0x280) != 0) goto LAB_00173517;
LAB_00173509:
          if ((u._1052_1_ & 0x20) != 0) goto LAB_00173517;
        }
LAB_0017365d:
        pcVar25 = Monnam(mtmp);
        pline("%s rebukes you, saying:",pcVar25);
        verbalize("Since you desire conflict, have some more!");
LAB_00173689:
        mongone(mtmp);
        uVar12 = mt_random();
        iVar6 = (uVar12 & 3) + 1;
        while (bVar36 = iVar6 != 0, iVar6 = iVar6 + -1, bVar36) {
          poss[0].y = u.uy;
          poss[0].x = u.ux;
          bVar5 = enexto(poss,level,u.ux,u.uy,mons + 0x7f);
          if (bVar5 != '\0') {
            mk_roamer(mons + 0x7f,u.ualign.type,level,poss[0].x,poss[0].y,'\0');
          }
        }
        return 2;
      }
      uVar34 = uVar34 | 0x40000;
    }
    if ((((u.uprops[0x15].extrinsic == 0 && u.uprops[0x15].intrinsic == 0) &&
         ((mtmp->field_0x62 & 0x20) == 0)) && (u.ustuck == mtmp)) &&
       (bVar5 = sticks(youmonst.data), bVar5 == '\0')) {
      unstuck(mtmp);
      pline("You get released!");
    }
    ppVar16 = mtmp->data;
    uVar7 = ppVar16->mflags1;
    if (((uVar7 >> 0xd & 1) == 0) && (ppVar16->msize != '\0')) {
      poVar13 = m_carrying(mtmp,0xe2);
      uVar34 = (ulong)(poVar13 != (obj *)0x0) << 0x18 | uVar34 | 0x400000;
      ppVar16 = mtmp->data;
      uVar7 = ppVar16->mflags1;
    }
    local_f8 = -1;
    iVar23 = mfndpos(mtmp,poss,info,
                     ((uVar7 & 0x20) << 0x16 | (ppVar16->mflags2 & 0x4000) << 10) | uVar34);
    plVar2 = level;
    cVar4 = (char)iVar23;
    uVar35 = 0;
    uVar34 = 0;
    if ('\0' < cVar4) {
      uVar34 = (ulong)(uint)(int)cVar4;
    }
    cVar19 = '\0';
    for (; uVar34 != uVar35; uVar35 = uVar35 + 1) {
      pmVar32 = plVar2->monsters[poss[uVar35].x][poss[uVar35].y];
      if (((pmVar32 == (monst *)0x0) || ((pmVar32->field_0x61 & 2) != 0)) ||
         ((*(byte *)((long)info + uVar35 * 8 + 2) & 8) != 0)) {
        bVar3 = cursed_object_at((int)poss[uVar35].x,(int)poss[uVar35].y);
        cVar19 = cVar19 + (bVar3 ^ 1);
      }
    }
    local_11c = dist2(iVar26,y0,(int)gx,(int)gy);
    iVar23 = 0x11;
    if (0x11 < iVar6) {
      iVar23 = iVar6;
    }
    uVar7 = (int)cVar4;
    if ((uVar12 >> 0x1a & 1) == 0) {
      uVar7 = (int)cVar19;
    }
    cVar4 = '\0';
    local_145 = x;
    local_110 = y;
    for (uVar35 = 0; uVar35 != uVar34; uVar35 = uVar35 + 1) {
      cVar22 = poss[uVar35].x;
      cVar21 = poss[uVar35].y;
      local_140 = (int)cVar22;
      iVar6 = (int)cVar21;
      cursemsg[uVar35] = '\0';
      if ((((mtmp->field_0x63 & 1) == 0) ||
          (iVar9 = dist2(local_140,iVar6,(int)u.ux,(int)u.uy), iVar9 < 5)) &&
         (((uVar12 >> 0x1a & 1) == 0 ||
          (iVar9 = dist2(local_140,iVar6,(int)u.ux,(int)u.uy), iVar9 < iVar23)))) {
        if (((((uint)info[uVar35] >> 0x13 & 1) == 0) ||
            (pmVar32 = level->monsters[cVar22][cVar21], pmVar32 == (monst *)0x0)) ||
           ((pmVar32->field_0x61 & 2) != 0)) {
          if ((((uint)info[uVar35] >> 0x11 & 1) != 0) &&
             (ptVar17 = t_at(level,local_140,iVar6), ptVar17 != (trap *)0x0)) {
            if ((mtmp->field_0x63 & 1) == 0) {
              if (((ptVar17->field_0x8 & 0x20) != 0) && (uVar10 = mt_random(), uVar10 % 0x28 != 0))
              goto LAB_00172afa;
            }
            else if (flags.soundok != '\0') {
              whimper(mtmp);
            }
          }
          iVar9 = (int)uVar35;
          if ((uVar12 >> 0x1a & 1) == 0) {
            bVar1 = false;
            pvVar30 = (vptrs *)(level->objects[cVar22] + cVar21);
            while (pmVar32 = pvVar30->v_ocarry, pmVar32 != (monst *)0x0) {
              if ((*(byte *)((long)pmVar32->mtrack + 6) & 1) == 0) {
                iVar11 = dogfood(mtmp,(obj *)pmVar32);
                if ((iVar11 * 0x1000000 < 0x2000001) &&
                   ((iVar11 * 0x1000000 != 0x2000000 ||
                    (*(uint *)((long)&mtmp[1].data + 4) <= moves)))) {
                  cursemsg[uVar35] = '\0';
                  bVar36 = false;
                  local_f8 = iVar9;
                  goto LAB_00172c1b;
                }
              }
              else {
                cursemsg[uVar35] = '\x01';
                bVar1 = true;
              }
              pvVar30 = (vptrs *)&pmVar32->data;
            }
            if ((((bVar1) && ((mtmp->field_0x63 & 1) == 0)) && ('\0' < cVar19)) &&
               (iVar11 = rn2(cVar19 * 0xd), iVar11 != 0)) goto LAB_00172afa;
          }
          iVar11 = uVar7 << 2;
          for (uVar31 = 0; (uVar31 < 4 && ((long)uVar31 < (long)(int)(uVar7 - 1)));
              uVar31 = uVar31 + 1) {
            if ((cVar22 == mtmp->mtrack[uVar31].x) &&
               ((cVar21 == mtmp->mtrack[uVar31].y && (iVar24 = rn2(iVar11), iVar24 != 0))))
            goto LAB_00172afa;
            iVar11 = iVar11 + -4;
          }
          iVar6 = dist2(local_140,iVar6,(int)gx,(int)gy);
          iVar11 = (iVar6 - local_11c) * iVar33;
          if (iVar11 == 0) {
            cVar4 = cVar4 + '\x01';
            uVar10 = rn2((int)cVar4);
LAB_00172ac3:
            if (uVar10 != 0) goto LAB_00172afa;
          }
          else if (-1 < iVar11) {
            if (bVar36) goto LAB_00172afa;
            if ((y != local_110 || x != local_145) || (uVar10 = mt_random(), uVar10 % 3 != 0)) {
              uVar10 = mt_random();
              uVar10 = uVar10 % 0xc;
              goto LAB_00172ac3;
            }
          }
          local_145 = cVar22;
          local_11c = iVar6;
          local_110 = cVar21;
          local_f8 = iVar9;
          if (iVar11 < 0) {
            cVar4 = '\0';
          }
        }
        else if ((uint)pmVar32->m_lev < mtmp->m_lev + 2) {
          ppVar16 = pmVar32->data;
          if (ppVar16 == mons + 0x1e) {
            uVar10 = mt_random();
            if (((((uVar10 % 10 != 0) && ((mtmp->field_0x62 & 2) != 0)) &&
                 (uVar10 = mtmp->data->mflags1, (uVar10 >> 0xc & 1) == 0)) &&
                ((*(uint *)&pmVar32->field_0x60 >> 0x11 & 1) != 0)) &&
               (((uVar10 >> 0x18 & 1) != 0 || ((*(uint *)&pmVar32->field_0x60 & 2) == 0))))
            goto LAB_00172afa;
            ppVar16 = pmVar32->data;
          }
          if ((ppVar16 != mons + 10) || (uVar10 = mt_random(), uVar10 % 10 == 0)) {
            iVar6 = max_passive_dmg(pmVar32,mtmp);
            if (iVar6 < mtmp->mhp) {
              if (mtmp->mhp * 4 < mtmp->mhpmax) {
LAB_00172856:
                if (((pmVar32->field_0x62 & 0x40) != 0) &&
                   ((u.uprops[0x15].intrinsic == 0 && (u.uprops[0x15].extrinsic == 0))))
                goto LAB_00172afa;
                ppVar16 = pmVar32->data;
              }
              else {
                ppVar16 = pmVar32->data;
                if ((ppVar16->msound == '!') || (ppVar16->msound == '\x1f')) goto LAB_00172856;
              }
              if (((ppVar16 != mons + 0xdb) || ((mtmp->mintrinsics & 8) != 0)) &&
                 ((ppVar16 != mons + 0xb && ppVar16 != mons + 0xc ||
                  ((mtmp->mintrinsics & 0x80) != 0)))) {
                if (after != 0) {
                  return 0;
                }
                notonhead = '\0';
                uVar12 = mattackm(mtmp,pmVar32);
                if ((uVar12 & 4) != 0) {
                  return 2;
                }
                if ((uVar12 & 3) != 1) {
                  return 0;
                }
                uVar12 = mt_random();
                if ((uVar12 & 3) == 0) {
                  return 0;
                }
                if (pmVar32->mlstmv == moves) {
                  return 0;
                }
                bVar5 = onscary((int)mtmp->mx,(int)mtmp->my,pmVar32);
                if (bVar5 != '\0') {
                  return 0;
                }
                bVar5 = monnear(pmVar32,(int)mtmp->mx,(int)mtmp->my);
                if (bVar5 == '\0') {
                  return 0;
                }
                uVar12 = mattackm(pmVar32,mtmp);
                if ((uVar12 & 2) == 0) {
                  return 0;
                }
                return 2;
              }
            }
          }
        }
      }
LAB_00172afa:
    }
    bVar36 = true;
    pmVar32 = (monst *)0x0;
    cVar22 = local_145;
    cVar21 = local_110;
    local_140 = (int)local_145;
  }
LAB_00172c1b:
  if ((cVar22 == x) && (cVar21 == y)) {
    if ((mtmp->field_0x63 & 1) == 0) {
      return 1;
    }
    iVar6 = dist2(iVar26,y0,(int)u.ux,(int)u.uy);
    if (iVar6 < 5) {
      return 1;
    }
    iVar6 = sgn(iVar26 - u.ux);
    iVar26 = sgn(y0 - u.uy);
    cc.x = u.ux + (char)iVar6;
    cc.y = u.uy + (char)iVar26;
    bVar5 = goodpos(level,(int)cc.x,(int)cc.y,mtmp,0);
    if (bVar5 == '\0') {
      iVar6 = xytod((char)iVar6,(char)iVar26);
      uVar34 = (long)(iVar6 + 7) % 8 & 0xffffffff;
      do {
        iVar26 = (int)uVar34;
        if ((iVar6 + 1) % 8 <= iVar26) {
          uVar34 = (long)(iVar6 + 6) % 8 & 0xffffffff;
          goto LAB_0017313c;
        }
        dtoxy(&cc,iVar26);
        bVar5 = goodpos(level,(int)cc.x,(int)cc.y,mtmp,0);
        uVar34 = (ulong)(iVar26 + 1);
      } while (bVar5 == '\0');
    }
LAB_001733cc:
    bVar5 = m_in_out_region(mtmp,x,y);
    if (bVar5 == '\0') {
      return 1;
    }
    remove_monster(level,(int)mtmp->mx,(int)mtmp->my);
    place_monster(mtmp,(int)cc.x,(int)cc.y);
    newsym((int)cc.x,(int)cc.y);
    set_apparxy(level,mtmp);
    return 1;
  }
  if ((*(byte *)((long)info + (long)local_f8 * 8 + 2) & 4) != 0) {
    if ((mtmp->field_0x63 & 1) != 0) {
      pcVar25 = Monnam(mtmp);
      iVar6 = pronoun_gender(level,mtmp);
      pline("%s breaks loose of %s leash!",pcVar25,genders[iVar6].his);
      m_unleash(mtmp,'\0');
    }
    mattacku(mtmp);
    return 0;
  }
  iVar6 = (int)cVar21;
  bVar5 = m_in_out_region(mtmp,cVar22,cVar21);
  if (bVar5 == '\0') {
    return 1;
  }
  if (((('\x10' < level->locations[cVar22][cVar21].typ) ||
       (bVar5 = may_dig(level,cVar22,cVar21), bVar5 == '\0')) &&
      (bVar5 = closed_door(level,local_140,iVar6), bVar5 == '\0')) ||
     ((mtmp->weapon_check == '\0' || ((~mtmp->data->mflags1 & 0x60) != 0)))) goto LAB_00172f58;
  bVar5 = closed_door(level,local_140,iVar6);
  xVar20 = '\x06';
  if (bVar5 == '\0') {
    cVar4 = level->locations[cVar22][cVar21].typ;
    if ((cVar4 != '\r') &&
       ((cVar4 != '\0' || ((*(uint *)&(level->flags).field_0x8 & 0x100000) == 0)))) {
      poVar13 = mtmp->mw;
      xVar20 = '\x04';
      if ((poVar13 != (obj *)0x0) &&
         (((byte)(poVar13->oclass | 4U) == 6 && (objects[poVar13->otyp].oc_subtyp == '\x04'))))
      goto LAB_0017381a;
      goto LAB_00172f3f;
    }
    poVar13 = mtmp->mw;
    xVar20 = '\x05';
    if ((poVar13 == (obj *)0x0) ||
       (((byte)(poVar13->oclass | 4U) != 6 || (objects[poVar13->otyp].oc_subtyp != '\x03'))))
    goto LAB_00172f3f;
LAB_0017381a:
    if (mtmp->weapon_check < '\x04') goto LAB_00172f58;
  }
  else {
LAB_00172f3f:
    mtmp->weapon_check = xVar20;
  }
  iVar23 = mon_wield_item(mtmp);
  if (iVar23 != 0) {
    return 0;
  }
LAB_00172f58:
  remove_monster(level,iVar26,y0);
  place_monster(mtmp,local_140,iVar6);
  if ((cursemsg[local_f8] != '\0') &&
     (((viz_array[y][x] & 2U) != 0 || ((viz_array[cVar21][cVar22] & 2U) != 0)))) {
    pcVar25 = Monnam(mtmp);
    pline("%s moves only reluctantly.",pcVar25);
  }
  for (lVar18 = 0x25; lVar18 != 0x22; lVar18 = lVar18 + -1) {
    mtmp->mtrack[lVar18 + -0x22] = mtmp->mtrack[lVar18 + -0x23];
  }
  mtmp->mtrack[0].x = x;
  mtmp->mtrack[0].y = y;
  if (!bVar36) {
    iVar6 = dog_eat(mtmp,(obj *)pmVar32,iVar26,y0,'\0');
    return (iVar6 == 2) + 1;
  }
  return 1;
  while( true ) {
    dtoxy(&cc,iVar26);
    bVar5 = goodpos(level,(int)cc.x,(int)cc.y,mtmp,0);
    uVar34 = (ulong)(iVar26 + 1);
    if (bVar5 != '\0') break;
LAB_0017313c:
    iVar26 = (int)uVar34;
    if ((iVar6 + 2) % 8 <= iVar26) {
      cc.x = mtmp->mx;
      cc.y = mtmp->my;
      break;
    }
  }
  goto LAB_001733cc;
}

Assistant:

int dog_move(struct monst *mtmp, 
	     int after)	/* this is extra fast monster movement */
{
	int omx, omy;		/* original mtmp position */
	int appr, whappr, udist;
	int i, j, k;
	struct edog *edog = EDOG(mtmp);
	struct obj *obj = NULL;
	xchar otyp;
	boolean has_edog, cursemsg[9], do_eat = FALSE;
	xchar nix, niy;		/* position mtmp is (considering) moving to */
	int nx, ny;	/* temporary coordinates */
	xchar cnt, uncursedcnt, chcnt;
	int chi = -1, nidist, ndist;
	coord poss[9];
	long info[9], allowflags;
#define GDIST(x,y) (dist2(x,y,gx,gy))

	/*
	 * Tame Angels have isminion set and an ispriest structure instead of
	 * an edog structure.  Fortunately, guardian Angels need not worry
	 * about mundane things like eating and fetching objects, and can
	 * spend all their energy defending the player.  (They are the only
	 * monsters with other structures that can be tame.)
	 */
	has_edog = !mtmp->isminion;

	omx = mtmp->mx;
	omy = mtmp->my;
	if (has_edog && dog_hunger(mtmp, edog)) return 2;	/* starved */

	udist = distu(omx,omy);
	/* Let steeds eat and maybe throw rider during Conflict */
	if (mtmp == u.usteed) {
	    if (Conflict && !resist(mtmp, RING_CLASS, 0, 0)) {
		dismount_steed(DISMOUNT_THROWN);
		return 1;
	    }
	    udist = 1;
	} else if (!udist)
	/* maybe we tamed him while being swallowed --jgm */
		return 0;

	nix = omx;	/* set before newdogpos */
	niy = omy;
	cursemsg[0] = FALSE;	/* lint suppression */
	info[0] = 0;		/* ditto */

	if (has_edog) {
	    j = dog_invent(mtmp, edog, udist);
	    if (j == 2) return 2;		/* died */
	    else if (j == 1) goto newdogpos;	/* eating something */

	    whappr = (moves - edog->whistletime < 5);
	} else
	    whappr = 0;

	appr = dog_goal(mtmp, has_edog ? edog : NULL,
							after, udist, whappr);
	if (appr == -2) return 0;

	allowflags = ALLOW_M | ALLOW_TRAPS | ALLOW_SSM | ALLOW_SANCT;
	if (passes_walls(mtmp->data)) allowflags |= (ALLOW_ROCK | ALLOW_WALL);
	if (passes_bars(mtmp->data) || metallivorous(mtmp->data))
	    allowflags |= ALLOW_BARS;
	if (throws_rocks(mtmp->data)) allowflags |= ALLOW_ROCK;
	if (Conflict && !resist(mtmp, RING_CLASS, 0, 0)) {
	    allowflags |= ALLOW_U;
	    if (!has_edog) {
		coord mm;
		/* Guardian angel refuses to be conflicted; rather,
		 * it disappears, angrily, and sends in some nasties
		 */
		if (canspotmon(level, mtmp)) {
		    pline("%s rebukes you, saying:", Monnam(mtmp));
		    verbalize("Since you desire conflict, have some more!");
		}
		mongone(mtmp);
		i = rnd(4);
		while (i--) {
		    mm.x = u.ux;
		    mm.y = u.uy;
		    if (enexto(&mm, level, mm.x, mm.y, &mons[PM_ANGEL]))
			mk_roamer(&mons[PM_ANGEL], u.ualign.type,
					 level, mm.x, mm.y, FALSE);
		}
		return 2;

	    }
	}
	if (!Conflict && !mtmp->mconf &&
	    mtmp == u.ustuck && !sticks(youmonst.data)) {
	    unstuck(mtmp);	/* swallowed case handled above */
	    pline("You get released!");
	}
	if (!nohands(mtmp->data) && !verysmall(mtmp->data)) {
		allowflags |= OPENDOOR;
		if (m_carrying(mtmp, SKELETON_KEY)) allowflags |= BUSTDOOR;
	}
	if (is_giant(mtmp->data)) allowflags |= BUSTDOOR;
	if (tunnels(mtmp->data)) allowflags |= ALLOW_DIG;
	cnt = mfndpos(mtmp, poss, info, allowflags);

	/* Normally dogs don't step on cursed items, but if they have no
	 * other choice they will.  This requires checking ahead of time
	 * to see how many uncursed item squares are around.
	 */
	uncursedcnt = 0;
	for (i = 0; i < cnt; i++) {
		nx = poss[i].x; ny = poss[i].y;
		if (MON_AT(level, nx,ny) && !(info[i] & ALLOW_M)) continue;
		if (cursed_object_at(nx, ny)) continue;
		uncursedcnt++;
	}

	chcnt = 0;
	chi = -1;
	nidist = GDIST(nix,niy);

	for (i = 0; i < cnt; i++) {
		nx = poss[i].x;
		ny = poss[i].y;
		cursemsg[i] = FALSE;

		/* if leashed, we drag him along. */
		if (mtmp->mleashed && distu(nx, ny) > 4) continue;

		/* if a guardian, try to stay close by choice */
		if (!has_edog &&
		    (j = distu(nx, ny)) > 16 && j >= udist) continue;

		if ((info[i] & ALLOW_M) && MON_AT(level, nx, ny)) {
		    int mstatus;
		    struct monst *mtmp2 = m_at(level, nx,ny);

		    if ((int)mtmp2->m_lev >= (int)mtmp->m_lev+2 ||
			(mtmp2->data == &mons[PM_FLOATING_EYE] && rn2(10) &&
			 mtmp->mcansee && haseyes(mtmp->data) && mtmp2->mcansee
			 && (perceives(mtmp->data) || !mtmp2->minvis)) ||
			(mtmp2->data==&mons[PM_GELATINOUS_CUBE] && rn2(10)) ||
			(max_passive_dmg(mtmp2, mtmp) >= mtmp->mhp) ||
			((mtmp->mhp*4 < mtmp->mhpmax
			  || mtmp2->data->msound == MS_GUARDIAN
			  || mtmp2->data->msound == MS_LEADER) &&
			 mtmp2->mpeaceful && !Conflict) ||
			(touch_disintegrates(mtmp2->data) &&
			 !resists_disint(mtmp)) ||
			(touch_petrifies(mtmp2->data) &&
			 !resists_ston(mtmp)))
			continue;

		    if (after) return 0; /* hit only once each move */

		    notonhead = 0;
		    mstatus = mattackm(mtmp, mtmp2);

		    /* aggressor (pet) died */
		    if (mstatus & MM_AGR_DIED) return 2;

		    if ((mstatus & MM_HIT) && !(mstatus & MM_DEF_DIED) &&
			    rn2(4) && mtmp2->mlstmv != moves &&
			    !onscary(mtmp->mx, mtmp->my, mtmp2) &&
			    /* monnear check needed: long worms hit on tail */
			    monnear(mtmp2, mtmp->mx, mtmp->my)) {
			mstatus = mattackm(mtmp2, mtmp);  /* return attack */
			if (mstatus & MM_DEF_DIED) return 2;
		    }

		    return 0;
		}

		{   /* Dog avoids harmful traps, but perhaps it has to pass one
		     * in order to follow player.  (Non-harmful traps do not
		     * have ALLOW_TRAPS in info[].)  The dog only avoids the
		     * trap if you've seen it, unlike enemies who avoid traps
		     * if they've seen some trap of that type sometime in the
		     * past.  (Neither behavior is really realistic.)
		     */
		    struct trap *trap;

		    if ((info[i] & ALLOW_TRAPS) && (trap = t_at(level, nx, ny))) {
			if (mtmp->mleashed) {
			    if (flags.soundok) whimper(mtmp);
			} else
			    /* 1/40 chance of stepping on it anyway, in case
			     * it has to pass one to follow the player...
			     */
			    if (trap->tseen && rn2(40)) continue;
		    }
		}

		/* dog eschews cursed objects, but likes dog food */
		/* (minion isn't interested; `cursemsg' stays FALSE) */
		if (has_edog)
		for (obj = level->objects[nx][ny]; obj; obj = obj->nexthere) {
		    if (obj->cursed) cursemsg[i] = TRUE;
		    else if ((otyp = dogfood(mtmp, obj)) < MANFOOD &&
			     (otyp < ACCFOOD || edog->hungrytime <= moves)) {
			/* Note: our dog likes the food so much that he
			 * might eat it even when it conceals a cursed object */
			nix = nx;
			niy = ny;
			chi = i;
			do_eat = TRUE;
			cursemsg[i] = FALSE;	/* not reluctant */
			goto newdogpos;
		    }
		}
		/* didn't find something to eat; if we saw a cursed item and
		   aren't being forced to walk on it, usually keep looking */
		if (cursemsg[i] && !mtmp->mleashed && uncursedcnt > 0 &&
		    rn2(13 * uncursedcnt)) continue;

		/* lessen the chance of backtracking to previous position(s) */
		k = has_edog ? uncursedcnt : cnt;
		for (j = 0; j < MTSZ && j < k - 1; j++)
			if (nx == mtmp->mtrack[j].x && ny == mtmp->mtrack[j].y)
				if (rn2(MTSZ * (k - j))) goto nxti;

		j = ((ndist = GDIST(nx,ny)) - nidist) * appr;
		if ((j == 0 && !rn2(++chcnt)) || j < 0 ||
			(j > 0 && !whappr &&
				((omx == nix && omy == niy && !rn2(3))
					|| !rn2(12))
			)) {
			nix = nx;
			niy = ny;
			nidist = ndist;
			if (j < 0) chcnt = 0;
			chi = i;
		}
	nxti:	;
	}
newdogpos:
	if (nix != omx || niy != omy) {
		struct obj *mw_tmp;

		if (info[chi] & ALLOW_U) {
			if (mtmp->mleashed) { /* play it safe */
				pline("%s breaks loose of %s leash!",
				      Monnam(mtmp), mhis(level, mtmp));
				m_unleash(mtmp, FALSE);
			}
			mattacku(mtmp);
			return 0;
		}
		if (!m_in_out_region(mtmp, nix, niy))
		    return 1;
		if (((IS_ROCK(level->locations[nix][niy].typ) && may_dig(level, nix,niy)) ||
		     closed_door(level, nix, niy)) &&
		    mtmp->weapon_check != NO_WEAPON_WANTED &&
		    tunnels(mtmp->data) && needspick(mtmp->data)) {
		    if (closed_door(level, nix, niy)) {
			if (!(mw_tmp = MON_WEP(mtmp)) ||
			    !is_pick(mw_tmp) || !is_axe(mw_tmp))
			    mtmp->weapon_check = NEED_PICK_OR_AXE;
		    } else if (IS_TREE(level, level->locations[nix][niy].typ)) {
			if (!(mw_tmp = MON_WEP(mtmp)) || !is_axe(mw_tmp))
			    mtmp->weapon_check = NEED_AXE;
		    } else if (!(mw_tmp = MON_WEP(mtmp)) || !is_pick(mw_tmp)) {
			mtmp->weapon_check = NEED_PICK_AXE;
		    }
		    if (mtmp->weapon_check >= NEED_PICK_AXE &&
			mon_wield_item(mtmp))
			return 0;
		}
		/* insert a worm_move() if worms ever begin to eat things */
		remove_monster(level, omx, omy);
		place_monster(mtmp, nix, niy);
		if (cursemsg[chi] && (cansee(omx,omy) || cansee(nix,niy)))
			pline("%s moves only reluctantly.", Monnam(mtmp));
		for (j=MTSZ-1; j>0; j--) mtmp->mtrack[j] = mtmp->mtrack[j-1];
		mtmp->mtrack[0].x = omx;
		mtmp->mtrack[0].y = omy;
		/* We have to know if the pet's gonna do a combined eat and
		 * move before moving it, but it can't eat until after being
		 * moved.  Thus the do_eat flag.
		 */
		if (do_eat) {
		    if (dog_eat(mtmp, obj, omx, omy, FALSE) == 2) return 2;
		}
	} else if (mtmp->mleashed && distu(omx, omy) > 4) {
		/* an incredible kludge, but the only way to keep pooch near
		 * after it spends time eating or in a trap, etc.
		 */
		coord cc;

		nx = sgn(omx - u.ux);
		ny = sgn(omy - u.uy);
		cc.x = u.ux + nx;
		cc.y = u.uy + ny;
		if (goodpos(level, cc.x, cc.y, mtmp, 0)) goto dognext;

		i  = xytod(nx, ny);
		for (j = (i + 7)%8; j < (i + 1)%8; j++) {
			dtoxy(&cc, j);
			if (goodpos(level, cc.x, cc.y, mtmp, 0)) goto dognext;
		}
		for (j = (i + 6)%8; j < (i + 2)%8; j++) {
			dtoxy(&cc, j);
			if (goodpos(level, cc.x, cc.y, mtmp, 0)) goto dognext;
		}
		cc.x = mtmp->mx;
		cc.y = mtmp->my;
dognext:
		if (!m_in_out_region(mtmp, nix, niy))
		  return 1;
		remove_monster(level, mtmp->mx, mtmp->my);
		place_monster(mtmp, cc.x, cc.y);
		newsym(cc.x,cc.y);
		set_apparxy(level, mtmp);
	}
	return 1;
}